

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall
ON_BinaryArchive::BeginRead3dmBigChunk(ON_BinaryArchive *this,uint *typecode,ON__INT64 *value)

{
  ulong uVar1;
  ON__UINT64 bytes_forward;
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  ON__UINT64 OVar5;
  ON__UINT64 OVar6;
  ON__UINT64 pos2;
  ON__UINT64 pos1;
  ON__UINT64 pos0;
  ON__UINT64 EOF_chunk_length;
  ON__UINT64 sizeof_file;
  bool rc;
  ulong uStack_38;
  uint saved_error_message_mask;
  ON__INT64 v;
  ulong *puStack_28;
  ON__UINT32 t;
  ON__INT64 *value_local;
  uint *typecode_local;
  ON_BinaryArchive *this_local;
  
  puStack_28 = (ulong *)value;
  value_local = (ON__INT64 *)typecode;
  typecode_local = (uint *)this;
  bVar2 = ReadMode(this);
  if (bVar2) {
    v._4_4_ = 0;
    uStack_38 = 0;
    this->m_bDoChunkCRC = false;
    sizeof_file._4_4_ = this->m_error_message_mask;
    this->m_error_message_mask = this->m_error_message_mask | 1;
    sizeof_file._3_1_ = ReadChunkTypecode(this,(ON__UINT32 *)((long)&v + 4));
    this->m_error_message_mask = sizeof_file._4_4_;
    if ((bool)sizeof_file._3_1_) {
      if (v._4_4_ == 0x7fff) {
        EOF_chunk_length = 0;
        if ((bool)sizeof_file._3_1_) {
          sizeof_file._3_1_ = ReadChunkValue(this,0x7fff,(ON__INT64 *)&stack0xffffffffffffffc8);
        }
        uVar1 = uStack_38;
        if ((((bool)sizeof_file._3_1_ == false) || ((long)uStack_38 < 0)) ||
           (sVar4 = SizeofChunkLength(this), bytes_forward = uStack_38, uVar1 < sVar4)) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                     ,0x18d5,"","ON_BinaryArchive::BeginRead3dmChunk() - file is damaged.");
          sizeof_file._3_1_ = 0;
          v._4_4_ = 0;
        }
        else {
          OVar5 = CurrentPosition(this);
          sizeof_file._3_1_ = ReadEOFSizeOfFile(this,&EOF_chunk_length);
          OVar6 = CurrentPosition(this);
          if (((OVar5 != 0) && (OVar5 < OVar6)) &&
             (bVar2 = SeekBackward(this,OVar6 - OVar5), !bVar2)) {
            sizeof_file._3_1_ = 0;
          }
          if (((sizeof_file._3_1_ & 1) != 0) && (bVar2 = SeekForward(this,bytes_forward), bVar2)) {
            OVar5 = CurrentPosition(this);
            if (this->m_3dm_version < 2) {
              uVar3 = (*this->_vptr_ON_BinaryArchive[5])();
              if ((uVar3 & 1) == 0) {
                v._4_4_ = 0x7ffe;
              }
            }
            else if (OVar5 != EOF_chunk_length) {
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                         ,0x18ca,"",
                         "ON_BinaryArchive::BeginRead3dmChunk() - Rogue eof marker in v2 file.\n");
            }
            sizeof_file._3_1_ = SeekBackward(this,bytes_forward);
          }
          if ((sizeof_file._3_1_ & 1) != 0) {
            sizeof_file._3_1_ = PushBigChunk(this,v._4_4_,uStack_38);
          }
        }
      }
      else {
        if ((bool)sizeof_file._3_1_) {
          sizeof_file._3_1_ = ReadChunkValue(this,v._4_4_,(ON__INT64 *)&stack0xffffffffffffffc8);
        }
        if ((bool)sizeof_file._3_1_ != false) {
          sizeof_file._3_1_ = PushBigChunk(this,v._4_4_,uStack_38);
        }
      }
    }
    if (value_local != (ON__INT64 *)0x0) {
      *(ON__UINT32 *)value_local = v._4_4_;
    }
    if (puStack_28 != (ulong *)0x0) {
      *puStack_28 = uStack_38;
    }
    this_local._7_1_ = (bool)(sizeof_file._3_1_ & 1);
  }
  else {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,0x1893,"","ReadMode() = false.");
    if (value_local != (ON__INT64 *)0x0) {
      *(undefined4 *)value_local = 0;
    }
    if (puStack_28 != (ulong *)0x0) {
      *puStack_28 = 0;
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_BinaryArchive::BeginRead3dmBigChunk( unsigned int* typecode, ON__INT64* value )
{
  if (false == ReadMode())
  {
    ON_ERROR("ReadMode() = false.");
    if (typecode)
      *typecode = 0;
    if (value)
      *value = 0;
    return false;
  }

  ON__UINT32 t = 0;
  ON__INT64 v = 0;
  m_bDoChunkCRC = false; // no CRC on chunk headers because length is written twice
  const unsigned int saved_error_message_mask = m_error_message_mask;
  m_error_message_mask |= 0x0001; // disable ReadByte() error message at EOF
  bool rc = ReadChunkTypecode( &t );
  m_error_message_mask = saved_error_message_mask;
  if (rc) 
  {
    if ( t == TCODE_ENDOFFILE ) 
    {
      // Either this chunk is a bona fide end of file mark, or it's "goo" 
      // that Rhino 1.0 or the pre-February 2000 Rhino 1.1 saved and wrote.
      ON__UINT64 sizeof_file = 0;
      if ( rc )
        rc = ReadChunkValue( t, &v );
      if ( rc && v >= 0 && ((ON__UINT64)v) >= SizeofChunkLength() ) 
      {
        ON__UINT64 EOF_chunk_length = (ON__UINT64)v;
        ON__UINT64 pos0 = CurrentPosition();
        rc = ReadEOFSizeOfFile( &sizeof_file );
        ON__UINT64 pos1 = CurrentPosition();
        if ( pos0 > 0 && pos1 > pos0 )
        {
          if ( !SeekBackward(pos1-pos0) )
            rc = false;
        }
        if ( rc ) 
        {
          if ( SeekForward( EOF_chunk_length ) )
          {
            ON__UINT64 pos2 = CurrentPosition(); 
            if ( m_3dm_version <= 1 )
            {
              if ( !AtEnd() ) 
              {
                // Rhino v1 reads chunks with unknown typecodes as a block of "goo"
                // and then saves them back into file.  When this happens to an
                // eof marker, we get TCODE_ENDOFFILE chunks in the middle of a file.
                // This can only happen in m_3dm_version = 1 files.
                t = TCODE_ENDOFFILE_GOO;
              }
            }
            else
            {
              // check that current position matches saved file size
              if ( pos2 != sizeof_file ) {
                ON_ERROR("ON_BinaryArchive::BeginRead3dmChunk() - Rogue eof marker in v2 file.\n");
              }
            }
            rc = SeekBackward( EOF_chunk_length );
          }
        }
        if ( rc )
          rc = PushBigChunk( t, v );
      }
      else 
      {
        ON_ERROR( "ON_BinaryArchive::BeginRead3dmChunk() - file is damaged." );
        rc = false;
        t = 0; // ?? file is trashed ??
      }
    }
    else 
    {
      if ( rc )
        rc = ReadChunkValue( t, &v );
      if ( rc )
        rc = PushBigChunk( t, v );
    }
  }
  if ( typecode )
    *typecode = t;
  if ( value )
    *value = v;
  return rc;
}